

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mconfig.cpp
# Opt level: O0

void MConfig::copyValue(void *dst,int type,QVariant *value)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  QPoint QVar5;
  float fVar6;
  QPointF QVar7;
  QRect QVar8;
  QMessageLogger local_128;
  undefined1 local_108 [16];
  QUrl *ptr_11;
  undefined8 local_f0;
  QDateTime *ptr_10;
  QPoint local_e0;
  QPoint local_d8;
  QPoint local_d0;
  QPoint *local_c8;
  QRectF *ptr_9;
  QPoint local_b8;
  QPoint *local_b0;
  QRect *ptr_8;
  QPoint local_a0;
  QPoint *local_98;
  QPointF *ptr_7;
  QPoint *local_88;
  QPoint *ptr_6;
  float *ptr_5;
  bool *ptr_4;
  QPoint *local_58;
  QString *ptr_3;
  QPoint *local_38;
  QByteArray *ptr_2;
  uint *ptr_1;
  int *ptr;
  QVariant *value_local;
  QPoint *pQStack_10;
  int type_local;
  void *dst_local;
  
  ptr = (int *)value;
  value_local._4_4_ = type;
  pQStack_10 = (QPoint *)dst;
  uVar4 = QVariant::isNull();
  if ((uVar4 & 1) != 0) {
    return;
  }
  if (value_local._4_4_ - 1U < 0x25 || value_local._4_4_ == 0x26) {
    switch((long)&switchD_00108c36::switchdataD_0010e190 +
           (long)(int)(&switchD_00108c36::switchdataD_0010e190)[value_local._4_4_ - 1U]) {
    case 0x108c38:
      ptr_1 = (uint *)pQStack_10;
      uVar2 = QVariant::value<int>((QVariant *)ptr);
      *ptr_1 = uVar2;
      break;
    case 0x108c56:
      ptr_2 = (QByteArray *)pQStack_10;
      uVar3 = QVariant::value<unsigned_int>((QVariant *)ptr);
      *(uint *)&(ptr_2->d).d = uVar3;
      break;
    case 0x108c74:
      local_38 = pQStack_10;
      QVariant::value<QByteArray>((QByteArray *)&ptr_3,(QVariant *)ptr);
      QByteArray::operator=((QByteArray *)local_38,(QByteArray *)&ptr_3);
      QByteArray::~QByteArray((QByteArray *)&ptr_3);
      break;
    case 0x108ca4:
      local_58 = pQStack_10;
      QVariant::value<QString>((QString *)&ptr_4,(QVariant *)ptr);
      QString::operator=((QString *)local_58,(QString *)&ptr_4);
      QString::~QString((QString *)&ptr_4);
      break;
    case 0x108cd4:
      ptr_5 = (float *)pQStack_10;
      bVar1 = QVariant::value<bool>((QVariant *)ptr);
      *(bool *)ptr_5 = bVar1;
      break;
    case 0x108cf5:
      ptr_6 = pQStack_10;
      fVar6 = QVariant::value<float>((QVariant *)ptr);
      ptr_6->xp = (int)fVar6;
      break;
    case 0x108d13:
      local_88 = pQStack_10;
      QVar5 = QVariant::value<QPoint>((QVariant *)ptr);
      *local_88 = QVar5;
      break;
    case 0x108d3e:
      local_98 = pQStack_10;
      QVar7 = QVariant::value<QPointF>((QVariant *)ptr);
      ptr_8 = (QRect *)QVar7.xp;
      *local_98 = (QPoint)ptr_8;
      local_a0 = (QPoint)QVar7.yp;
      local_98[1] = local_a0;
      break;
    case 0x108d83:
      local_b0 = pQStack_10;
      QVar8 = QVariant::value<QRect>((QVariant *)ptr);
      ptr_9 = QVar8._0_8_;
      *local_b0 = (QPoint)ptr_9;
      local_b8 = QVar8._8_8_;
      local_b0[1] = local_b8;
      break;
    case 0x108dc6:
      local_c8 = pQStack_10;
      QVariant::value<QRectF>((QRectF *)&ptr_10,(QVariant *)ptr);
      *local_c8 = (QPoint)ptr_10;
      local_c8[1] = local_e0;
      local_c8[2] = local_d8;
      local_c8[3] = local_d0;
      break;
    case 0x108e18:
      local_f0 = pQStack_10;
      QVariant::value<QDateTime>((QVariant *)&ptr_11);
      QDateTime::operator=((QDateTime *)local_f0,(QDateTime *)&ptr_11);
      QDateTime::~QDateTime((QDateTime *)&ptr_11);
      break;
    case 0x108e54:
      local_108._8_8_ = pQStack_10;
      QVariant::value<QUrl>((QVariant *)local_108);
      QUrl::operator=((QUrl *)local_108._8_8_,(QUrl *)local_108);
      QUrl::~QUrl((QUrl *)local_108);
      break;
    case 0x108e90:
      goto switchD_00108c36_caseD_108e90;
    }
  }
  else {
switchD_00108c36_caseD_108e90:
    QMessageLogger::QMessageLogger(&local_128,(char *)0x0,0,(char *)0x0);
    QMessageLogger::fatal((char *)&local_128,"Config: type unsupported!");
  }
  return;
}

Assistant:

void MConfig::copyValue(void *dst, int type, const QVariant &value)
{
    if (value.isNull()) {
        return;
    }

    // In Qt6 arguments of QVariant::canConvert has changed (QVariant::Type is deprecated)
    #if QT_VERSION >= 0x060000
        #define TYPE QMetaType
    #else
        #define TYPE int
    #endif
    Q_ASSERT(value.canConvert(TYPE(type)));
    #undef TYPE

    switch (type) {
        case QMetaType::Int:
            COPY_TYPE(int)
        case QMetaType::UInt:
            COPY_TYPE(uint)
        case QMetaType::QByteArray:
            COPY_TYPE(QByteArray)
        case QMetaType::QString:
            COPY_TYPE(QString)
        case QMetaType::Bool:
            COPY_TYPE(bool)
        case QMetaType::Float:
            COPY_TYPE(float)
        case QMetaType::QPoint:
            COPY_TYPE(QPoint)
        case QMetaType::QPointF:
            COPY_TYPE(QPointF)
        case QMetaType::QRect:
            COPY_TYPE(QRect)
        case QMetaType::QRectF:
            COPY_TYPE(QRectF)
        case QMetaType::QDateTime:
            COPY_TYPE(QDateTime)
        case QMetaType::QUrl:
            COPY_TYPE(QUrl)
        default:
            qFatal("Config: type unsupported!");
    }
}